

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDual.c
# Opt level: O2

void Saig_ManBlockPo(Aig_Man_t *pAig,int nCycles)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *p1;
  Aig_Obj_t *pFaninNew;
  int iVar2;
  bool bVar3;
  
  if (0 < nCycles) {
    p1 = pAig->pConst1;
    pAVar1 = p1;
    iVar2 = nCycles;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      Aig_ObjCreateCo(pAig,pAVar1);
      pAVar1 = Aig_ObjCreateCi(pAig);
      p1 = Aig_And(pAig,p1,pAVar1);
    }
    for (iVar2 = 0; iVar2 < pAig->nTruePos; iVar2 = iVar2 + 1) {
      pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar2);
      pFaninNew = Aig_And(pAig,pAVar1->pFanin0,p1);
      Aig_ObjPatchFanin0(pAig,pAVar1,pFaninNew);
    }
    Aig_ManSetRegNum(pAig,nCycles + pAig->nRegs);
    Aig_ManCleanup(pAig);
    return;
  }
  __assert_fail("nCycles > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDual.c"
                ,0xd5,"void Saig_ManBlockPo(Aig_Man_t *, int)");
}

Assistant:

void Saig_ManBlockPo( Aig_Man_t * pAig, int nCycles )
{
    Aig_Obj_t * pObj, * pCond, * pPrev, * pTemp;
    int i;
    assert( nCycles > 0 );
    // add N flops (assuming 1-hot encoding of cycles)
    pPrev = Aig_ManConst1(pAig);
    pCond = Aig_ManConst1(pAig);
    for ( i = 0; i < nCycles; i++ )
    {
        Aig_ObjCreateCo( pAig, pPrev );
        pPrev = Aig_ObjCreateCi( pAig );
        pCond = Aig_And( pAig, pCond, pPrev );
    }
    // update the POs
    Saig_ManForEachPo( pAig, pObj, i )
    {
        pTemp = Aig_And( pAig, Aig_ObjChild0(pObj), pCond );
        Aig_ObjPatchFanin0( pAig, pObj, pTemp );
    }
    // set the flops
    Aig_ManSetRegNum( pAig, Aig_ManRegNum(pAig) + nCycles );
    Aig_ManCleanup( pAig );
}